

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O2

void __thiscall FOptionMenuItemJoyMap::SetSelection(FOptionMenuItemJoyMap *this,int selection)

{
  FOptionValues *pFVar1;
  FOptionValues **ppFVar2;
  ulong uVar3;
  FName local_14;
  
  ppFVar2 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
            CheckKey(&OptionValues,&local_14);
  uVar3 = 0xffffffffffffffff;
  if (((ppFVar2 != (FOptionValues **)0x0) && (pFVar1 = *ppFVar2, pFVar1 != (FOptionValues *)0x0)) &&
     ((uint)selection < (pFVar1->mValues).Count)) {
    uVar3 = (ulong)(uint)(int)(pFVar1->mValues).Array[selection].Value;
  }
  (*SELECTED_JOYSTICK->_vptr_IJoystickConfig[0xb])
            (SELECTED_JOYSTICK,(ulong)*(uint *)&(this->super_FOptionMenuItemOptionBase).field_0x34,
             uVar3);
  return;
}

Assistant:

void SetSelection(int selection)
	{
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		// Map from menu selection to joystick axis.
		if (opt == NULL || *opt == NULL || (unsigned)selection >= (*opt)->mValues.Size())
		{
			selection = JOYAXIS_None;
		}
		else
		{
			selection = (int)(*opt)->mValues[selection].Value;
		}
		SELECTED_JOYSTICK->SetAxisMap(mAxis, (EJoyAxis)selection);
	}